

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockaddr.c
# Opt level: O0

char * str_sa_inet(nng_sockaddr_in *sa,char *buf,size_t bufsz)

{
  uint8_t *p_bytes;
  uint8_t *a_bytes;
  size_t bufsz_local;
  char *buf_local;
  nng_sockaddr_in *sa_local;
  
  snprintf(buf,bufsz,"%u.%u.%u.%u:%u",(ulong)(byte)sa->sa_addr,
           (ulong)*(byte *)((long)&sa->sa_addr + 1),(ulong)*(byte *)((long)&sa->sa_addr + 2),
           (uint)*(byte *)((long)&sa->sa_addr + 3),
           (uint)(byte)sa->sa_port * 0x100 + (uint)*(byte *)((long)&sa->sa_port + 1));
  return buf;
}

Assistant:

static const char *
str_sa_inet(const nng_sockaddr_in *sa, char *buf, size_t bufsz)
{
	uint8_t *a_bytes = (uint8_t *) &sa->sa_addr;
	uint8_t *p_bytes = (uint8_t *) &sa->sa_port;

	snprintf(buf, bufsz, "%u.%u.%u.%u:%u", a_bytes[0], a_bytes[1],
	    a_bytes[2], a_bytes[3],
	    (((uint16_t) p_bytes[0]) << 8) + p_bytes[1]);
	return (buf);
}